

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushAllowKeyboardFocus(bool allow_keyboard_focus)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  bool allow_keyboard_focus_local;
  
  window._7_1_ = allow_keyboard_focus;
  pIVar1 = GetCurrentWindow();
  (pIVar1->DC).AllowKeyboardFocus = (bool)(window._7_1_ & 1);
  ImVector<bool>::push_back
            (&(pIVar1->DC).AllowKeyboardFocusStack,(value_type_conflict2 *)((long)&window + 7));
  return;
}

Assistant:

void ImGui::PushAllowKeyboardFocus(bool allow_keyboard_focus)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.AllowKeyboardFocus = allow_keyboard_focus;
    window->DC.AllowKeyboardFocusStack.push_back(allow_keyboard_focus);
}